

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::reset(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        *this)

{
  vector<char,_std::allocator<char>_> *in_RDI;
  value_type_conflict *in_stack_ffffffffffffffd8;
  
  std::__cxx11::string::clear();
  std::vector<char,_std::allocator<char>_>::clear((vector<char,_std::allocator<char>_> *)0x19d77f);
  std::char_traits<char>::to_char_type
            ((int_type *)
             &(in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x10);
  std::vector<char,_std::allocator<char>_>::push_back(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void reset() noexcept
    {
        token_buffer.clear();
        token_string.clear();
        token_string.push_back(std::char_traits<char>::to_char_type(current));
    }